

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O3

int main(void)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  char *pcVar13;
  undefined8 uVar14;
  long *plVar15;
  long lVar16;
  size_t sVar17;
  undefined8 uVar18;
  char *pcVar19;
  xmlTextReader *reader;
  uint uVar20;
  char *pcVar21;
  bool bVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  xmlNodePtr list;
  char dtdContent [35];
  uint local_110;
  uint local_fc;
  char *local_c8;
  int iStack_c0;
  char acStack_bc [52];
  undefined8 local_88;
  ulong local_80;
  ulong local_78;
  undefined8 local_70;
  ulong local_68;
  ulong local_60;
  char local_58 [40];
  
  lVar10 = xmlNewDocNode(0,0,"c","");
  bVar30 = *(long *)(lVar10 + 0x18) != 0;
  if (bVar30) {
    main_cold_1();
  }
  xmlFreeNode(lVar10);
  xmlResetLastError();
  lVar10 = xmlReadDoc("<?xml version=\"1.0\" standalone=\"yes\"?>\n<doc></doc>\n",0,"UTF-8",0);
  if (lVar10 == 0) {
    main_cold_2();
  }
  xmlFreeDoc(lVar10);
  xmlResetLastError();
  lVar11 = xmlReadDoc("<doc/>",0,"#unsupported",0x40);
  if (lVar11 == 0) {
    main_cold_3();
  }
  uVar29 = (ulong)(lVar11 == 0);
  local_60 = (ulong)(lVar10 == 0);
  xmlFreeDoc(lVar11);
  lVar10 = xmlGetLastError();
  if ((((lVar10 == 0) || (*(int *)(lVar10 + 4) != 0x20)) || (*(int *)(lVar10 + 0x10) != 1)) ||
     (iVar5 = strcmp(*(char **)(lVar10 + 8),"Unsupported encoding: #unsupported\n"), iVar5 != 0)) {
    main_cold_4();
    uVar29 = 1;
  }
  uVar18 = 0;
  lVar10 = xmlReadDoc("<doc/>",0,0,0);
  uVar14 = *(undefined8 *)(lVar10 + 0x18);
  uVar12 = xmlNewReference(lVar10,"lt");
  xmlAddChild(uVar14,uVar12);
  pcVar13 = (char *)xmlNodeGetContent(lVar10);
  if ((*pcVar13 != '<') || (pcVar13[1] != '\0')) {
    main_cold_5();
    uVar18 = 1;
  }
  (*_xmlFree)(pcVar13);
  xmlFreeDoc(lVar10);
  xmlRegisterInputCallbacks(xmlFileMatch,xmlFileOpen,xmlFileRead,xmlFileClose);
  bVar31 = false;
  lVar10 = xmlReadFile("test/ent1",0,0);
  uVar23 = 1;
  if (lVar10 != 0) {
    lVar11 = xmlDocGetRootElement(lVar10);
    if ((lVar11 == 0) || (iVar5 = xmlStrEqual(*(undefined8 *)(lVar11 + 0x10),"EXAMPLE"), iVar5 == 0)
       ) {
      bVar31 = false;
    }
    else {
      uVar23 = 0;
      bVar31 = true;
    }
  }
  local_68 = uVar29;
  xmlFreeDoc(lVar10);
  xmlPopInputCallbacks();
  if (!bVar31) {
    main_cold_6();
  }
  builtin_strncpy(local_58,"<!ENTITY test \'<elem1/><elem2/>\'>\n",0x23);
  builtin_strncpy(acStack_bc,"c SYSTEM \'entities.dtd\'>\n<doc>&test;</doc>\n",0x2c);
  local_c8 = (char *)0x505954434f44213c;
  iStack_c0._0_1_ = 'E';
  iStack_c0._1_1_ = ' ';
  iStack_c0._2_1_ = 'd';
  iStack_c0._3_1_ = 'o';
  local_70 = uVar18;
  uVar14 = xmlParserInputBufferCreateStatic(local_58,0x22,0);
  lVar10 = xmlIOParseDTD(0,uVar14,0);
  plVar15 = (long *)xmlNewParserCtxt();
  plVar15[0x35] = lVar10;
  *(code **)(*plVar15 + 0xd0) = testSwitchDtdExtSubset;
  lVar11 = xmlCtxtReadMemory(plVar15,&local_c8,0x37,0,0,6);
  xmlFreeParserCtxt(plVar15);
  lVar16 = xmlGetDocEntity(lVar11,"test");
  bVar31 = *(long *)(*(long *)(lVar16 + 0x18) + 0x40) != 0;
  if (bVar31) {
    main_cold_7();
  }
  *(undefined8 *)(lVar11 + 0x58) = 0;
  xmlFreeDoc(lVar11);
  xmlFreeDtd(lVar10);
  lVar10 = xmlReadDoc("<doc xmlns:a=\'a\'><elem xmlns:b=\'b\'/></doc>",0,0);
  uVar14 = *(undefined8 *)(*(long *)(lVar10 + 0x18) + 0x18);
  lVar11 = xmlNewParserCtxt();
  lVar16 = 0;
  local_fc = 0;
  bVar4 = true;
  do {
    bVar22 = bVar4;
    pcVar13 = (&testCtxtParseContent_tests)[lVar16];
    bVar4 = true;
    do {
      bVar1 = bVar4;
      if (bVar1) {
        uVar12 = xmlNewInputFromString(0,pcVar13,2);
        local_c8 = (char *)xmlCtxtParseContent(lVar11,uVar12,uVar14);
      }
      else {
        sVar17 = strlen(pcVar13);
        xmlParseInNodeContext(uVar14,pcVar13,sVar17 & 0xffffffff,0,&local_c8);
      }
      pcVar19 = local_c8;
      uVar12 = xmlBufferCreate();
      uVar18 = xmlSaveToBuffer(uVar12,"UTF-8",0);
      for (; pcVar19 != (char *)0x0; pcVar19 = *(char **)(pcVar19 + 0x30)) {
        xmlSaveTree(uVar18,pcVar19);
      }
      xmlSaveClose(uVar18);
      pcVar19 = (char *)xmlBufferDetach(uVar12);
      xmlBufferFree(uVar12);
      if (((bVar1) && (*(int *)(lVar11 + 0x230) == 0)) ||
         (iVar5 = strcmp(pcVar19,pcVar13), iVar5 != 0)) {
        pcVar21 = "xmlParseInNodeContext";
        if (bVar1) {
          pcVar21 = "xmlCtxtParseContent";
        }
        fprintf(_stderr,"%s failed test %d, got:\n%s\n",pcVar21,lVar16,pcVar19);
        local_fc = 1;
      }
      (*_xmlFree)(pcVar19);
      xmlFreeNodeList();
      bVar4 = false;
    } while (bVar1);
    lVar16 = 1;
    bVar4 = false;
  } while (bVar22);
  xmlFreeParserCtxt(lVar11);
  xmlFreeDoc(lVar10);
  iVar5 = xmlParseBalancedChunkMemory
                    (0,0,0,0,"start <node xml:lang=\'en\'>abc</node> end",&local_c8);
  if (((iVar5 == 0) && (local_c8 != (char *)0x0)) &&
     ((lVar10 = *(long *)(local_c8 + 0x30), lVar10 != 0 &&
      ((*(int *)(lVar10 + 8) == 1 && (*(long *)(lVar10 + 0x60) != 0)))))) {
    iVar5 = xmlStrEqual(*(undefined8 *)(*(long *)(lVar10 + 0x60) + 0x10),
                        "http://www.w3.org/XML/1998/namespace");
    uVar20 = 0;
    if (iVar5 == 0) goto LAB_00102ce7;
  }
  else {
LAB_00102ce7:
    main_cold_8();
    uVar20 = 1;
  }
  xmlFreeNodeList(local_c8);
  lVar10 = xmlCreatePushParserCtxt(0,0,0,0,0);
  xmlParseChunk(lVar10,"<doc>",5,0);
  iVar5 = 1000000;
  do {
    xmlParseChunk(lVar10,"<elem>text</elem>",0x11,0);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  xmlParseChunk(lVar10,"</doc>",6,1);
  iVar5 = *(int *)(lVar10 + 0x18);
  xmlFreeDoc(*(undefined8 *)(lVar10 + 0x10));
  xmlFreeParserCtxt(lVar10);
  uVar14 = xmlBufferCreate();
  xmlBufferCat(uVar14,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCat(uVar14,"<doc><!-- ");
  iVar24 = 2000;
  do {
    xmlBufferCat(uVar14,"0123456789");
    iVar24 = iVar24 + -1;
  } while (iVar24 != 0);
  xmlBufferCat(uVar14," --></doc>");
  uVar12 = xmlBufferDetach(uVar14);
  xmlBufferFree(uVar14);
  lVar10 = xmlCreatePushParserCtxt(0,0,0,0,0);
  uVar6 = xmlStrlen(uVar12);
  xmlParseChunk(lVar10,uVar12,uVar6,0);
  xmlParseChunk(lVar10,0,0,1);
  xmlFreeDoc(*(undefined8 *)(lVar10 + 0x10));
  xmlFreeParserCtxt(lVar10);
  (*_xmlFree)(uVar12);
  uVar14 = xmlBufferCreate();
  xmlBufferCat(uVar14,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCat(uVar14,"<doc>");
  iVar24 = 2000;
  do {
    xmlBufferCat(uVar14,"0123456789");
    iVar24 = iVar24 + -1;
  } while (iVar24 != 0);
  xmlBufferCat(uVar14,"</doc>");
  uVar12 = xmlBufferDetach(uVar14);
  xmlBufferFree(uVar14);
  lVar10 = xmlCreatePushParserCtxt(0,0,0,0,0);
  uVar6 = xmlStrlen(uVar12);
  xmlParseChunk(lVar10,uVar12,uVar6,1);
  iVar24 = *(int *)(lVar10 + 0x18);
  xmlFreeDoc(*(undefined8 *)(lVar10 + 0x10));
  xmlFreeParserCtxt(lVar10);
  (*_xmlFree)(uVar12);
  uVar2 = 0;
  bVar4 = true;
  do {
    bVar22 = bVar4;
    lVar10 = xmlCreatePushParserCtxt(0,0,0,0,0);
    xmlCtxtSetOptions(lVar10,0x20);
    uVar14 = xmlBufferCreate();
    xmlBufferCCat(uVar14,"<doc>");
    pcVar13 = anon_var_dwarf_305;
    if (bVar22) {
      pcVar13 = "x";
    }
    xmlBufferCCat(uVar14,pcVar13);
    iVar25 = 2000;
    do {
      xmlBufferCCat(uVar14,"x");
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
    xmlBufferCCat(uVar14,"]");
    uVar12 = xmlBufferDetach(uVar14);
    xmlBufferFree(uVar14);
    uVar6 = xmlStrlen(uVar12);
    xmlParseChunk(lVar10,uVar12,uVar6,0);
    xmlParseChunk(lVar10,"]>xxx</doc>",0xb);
    if (*(int *)(lVar10 + 0x88) != 0x3e) {
      fprintf(_stderr,"xmlParseChunk failed to detect CData end: %d\n");
      uVar2 = 1;
    }
    (*_xmlFree)(uVar12);
    xmlFreeDoc(*(undefined8 *)(lVar10 + 0x10));
    xmlFreeParserCtxt();
    bVar4 = false;
  } while (bVar22);
  lVar10 = htmlReadDoc("<html><body><div id=\'myId\'>Hello, World!</div></body></html>",0,0,0);
  if (lVar10 == 0) {
    main_cold_10();
    local_110 = 1;
  }
  else {
    lVar11 = xmlGetID(lVar10,"myId");
    if (lVar11 == 0) {
      main_cold_9();
      local_110 = 1;
    }
    else {
      xmlFreeDoc(lVar10);
      local_110 = 0;
    }
  }
  lVar11 = htmlCreatePushParserCtxt(0,0,0,0,0,1);
  htmlParseChunk(lVar11,anon_var_dwarf_38d,4,1);
  lVar10 = *(long *)(lVar11 + 0x10);
  iVar25 = xmlStrEqual(*(undefined8 *)(lVar10 + 0x70),"UTF-8");
  if (iVar25 == 0) {
    main_cold_11();
  }
  uVar29 = (ulong)(iVar25 == 0);
  lVar16 = xmlDocGetRootElement(lVar10);
  iVar25 = xmlStrEqual(*(undefined8 *)
                        (*(long *)(*(long *)(*(long *)(lVar16 + 0x18) + 0x18) + 0x18) + 0x50),
                       anon_var_dwarf_38d);
  if (iVar25 == 0) {
    main_cold_12();
    uVar29 = 1;
  }
  xmlFreeDoc(lVar10);
  htmlFreeParserCtxt(lVar11);
  uVar14 = xmlBufferCreate();
  xmlBufferCCat(uVar14,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCCat(uVar14,"<doc>");
  iVar25 = 0x2000;
  do {
    xmlBufferCCat(uVar14,"x");
    iVar25 = iVar25 + -1;
  } while (iVar25 != 0);
  local_78 = uVar29;
  xmlBufferCCat(uVar14,"</doc>");
  uVar12 = xmlBufferDetach(uVar14);
  xmlBufferFree(uVar14);
  uVar14 = xmlReaderForDoc(uVar12,0,0,0);
  xmlTextReaderRead(uVar14);
  uVar18 = xmlTextReaderConstEncoding(uVar14);
  iVar25 = xmlStrEqual(uVar18,"ISO-8859-1");
  if (iVar25 == 0) {
    main_cold_13();
  }
  xmlFreeTextReader(uVar14);
  (*_xmlFree)(uVar12);
  uVar14 = xmlReaderForDoc("<d>x<e>y</e><f>z</f></d>",0,0,0);
  xmlTextReaderRead(uVar14);
  uVar12 = xmlTextReaderReadOuterXml(uVar14);
  iVar7 = xmlStrEqual(uVar12,"<d>x<e>y</e><f>z</f></d>");
  if (iVar7 == 0) {
    main_cold_14();
  }
  uVar29 = (ulong)(iVar7 == 0);
  (*_xmlFree)(uVar12);
  uVar12 = xmlTextReaderReadInnerXml(uVar14);
  iVar7 = xmlStrEqual(uVar12,"x<e>y</e><f>z</f>");
  if (iVar7 == 0) {
    main_cold_15();
    uVar29 = 1;
  }
  (*_xmlFree)(uVar12);
  uVar12 = xmlTextReaderReadString(uVar14);
  iVar7 = xmlStrEqual(uVar12,"xyz");
  if (iVar7 == 0) {
    main_cold_16();
    uVar29 = 1;
  }
  (*_xmlFree)(uVar12);
  xmlFreeTextReader(uVar14);
  uVar14 = 0;
  reader = (xmlTextReader *)
           xmlReaderForDoc("<d>\n  x<e a=\'v\'>y</e><f>z</f>\n  <![CDATA[cdata]]>\n  <!-- comment -->\n  <?pi content?>\n  <empty/>\n</d>"
                           ,0,0,0);
  iVar7 = xmlTextReaderRead(reader);
  if (0 < iVar7) {
    uVar14 = 0;
    do {
      iVar7 = testReaderNode(reader);
      if (iVar7 != 0) {
        uVar14 = 1;
        break;
      }
      iVar7 = xmlTextReaderMoveToFirstAttribute(reader);
      if (0 < iVar7) {
        do {
          iVar7 = testReaderNode(reader);
          if (iVar7 != 0) {
            uVar14 = 1;
            break;
          }
          iVar7 = xmlTextReaderMoveToNextAttribute(reader);
        } while (0 < iVar7);
        xmlTextReaderMoveToElement(reader);
      }
      iVar7 = xmlTextReaderRead(reader);
    } while (0 < iVar7);
  }
  local_88 = uVar14;
  xmlFreeTextReader(reader);
  uVar14 = xmlReaderForDoc("<doc xmlns:xi=\'http://www.w3.org/2001/XInclude\'>\n  <xi:include/>\n</doc>\n"
                           ,0,0,0x400);
  xmlTextReaderSetErrorHandler(uVar14,testReaderError,&local_c8);
  local_c8 = (char *)0x0;
  iStack_c0 = 0;
  do {
    iVar7 = xmlTextReaderRead(uVar14);
    pcVar13 = local_c8;
  } while (0 < iVar7);
  if (local_c8 != (char *)0x0) {
    pcVar19 = strstr(local_c8,"href or xpointer");
    uVar26 = 0;
    if (pcVar19 != (char *)0x0) goto LAB_00103339;
  }
  fwrite("xmlTextReaderSetErrorHandler failed\n",0x24,1,_stderr);
  uVar26 = 1;
  pcVar13 = local_c8;
LAB_00103339:
  (*_xmlFree)(pcVar13);
  xmlFreeTextReader(uVar14);
  uVar14 = xmlReaderForDoc("<doc xmlns:xi=\'http://www.w3.org/2001/XInclude\'>\n  <xi:include/>\n</doc>\n"
                           ,0,0,0x400);
  xmlTextReaderSetStructuredErrorHandler(uVar14,testStructuredReaderError,&local_c8);
  local_c8 = (char *)0x0;
  iStack_c0 = 0;
  do {
    iVar7 = xmlTextReaderRead(uVar14);
    pcVar13 = local_c8;
  } while (0 < iVar7);
  if (((iStack_c0 != 0x643) || (local_c8 == (char *)0x0)) ||
     (pcVar19 = strstr(local_c8,"href or xpointer"), pcVar19 == (char *)0x0)) {
    fwrite("xmlTextReaderSetStructuredErrorHandler failed\n",0x2e,1,_stderr);
    uVar26 = 1;
    pcVar13 = local_c8;
  }
  local_80 = uVar29;
  (*_xmlFree)(pcVar13);
  xmlFreeTextReader(uVar14);
  uVar14 = xmlOutputBufferCreateIO(testWriterIOWrite,testWriterIOClose,0,0);
  uVar14 = xmlNewTextWriter(uVar14);
  xmlTextWriterStartDocument(uVar14,"1.0","UTF-8",0);
  xmlTextWriterStartElement(uVar14,"elem");
  xmlTextWriterEndElement(uVar14);
  xmlTextWriterEndDocument(uVar14);
  uVar8 = xmlTextWriterClose(uVar14);
  if (uVar8 != 0x5f1) {
    fprintf(_stderr,"xmlTextWriterClose reported wrong error %d\n",(ulong)uVar8);
  }
  xmlFreeTextWriter(uVar14);
  lVar10 = 0x10;
  uVar3 = 0;
  do {
    lVar11 = *(long *)((long)&testCtxtParseContent_tests + lVar10);
    uVar14 = *(undefined8 *)((long)&PTR_anon_var_dwarf_1e3_00106c68 + lVar10);
    uVar12 = xmlBuildRelativeURI(lVar11,uVar14);
    lVar16 = *(long *)((long)&testBuildRelativeUri_tests + lVar10);
    if (*(long *)((long)&testBuildRelativeUri_tests + lVar10) == 0) {
      lVar16 = lVar11;
    }
    iVar7 = xmlStrEqual(uVar12,lVar16);
    if (iVar7 == 0) {
      fprintf(_stderr,"xmlBuildRelativeURI failed uri=%s base=%s result=%s expected=%s\n",lVar11,
              uVar14,uVar12,lVar16);
      uVar3 = 1;
    }
    (*_xmlFree)(uVar12);
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x130);
  uVar14 = xmlNewParserCtxt();
  xmlCtxtSetCharEncConvImpl(uVar14,rot13ConvImpl,0);
  charEncConvImplError = 0;
  uVar12 = xmlCtxtReadDoc(uVar14,"<?kzy irefvba=\'1.0\'?><qbp/>",0,"rot13",0);
  uVar28 = (uint)charEncConvImplError;
  xmlFreeParserCtxt(uVar14);
  lVar10 = xmlDocGetRootElement(uVar12);
  if ((lVar10 == 0) || (iVar7 = strcmp(*(char **)(lVar10 + 0x10),"doc"), iVar7 != 0)) {
    main_cold_17();
    uVar28 = 1;
  }
  uVar9 = (uint)local_60;
  uVar27 = (uint)local_68 | (uint)local_70;
  xmlFreeDoc(uVar12);
  return uVar2 | uVar3 |
         uVar28 | local_fc |
         (uint)local_78 | (uint)(iVar25 == 0) | (uint)local_80 | (uint)local_88 | uVar26 |
         (uint)(uVar8 != 0x5f1) |
         uVar23 | bVar31 | uVar20 | uVar27 | uVar9 | bVar30 | (uint)(iVar5 == 0) |
         iVar24 == 0 | local_110;
}

Assistant:

int
main(void) {
    int err = 0;

    err |= testNewDocNode();
    err |= testStandaloneWithEncoding();
    err |= testUnsupportedEncoding();
    err |= testNodeGetContent();
    err |= testCFileIO();
#ifdef LIBXML_VALID_ENABLED
    err |= testSwitchDtd();
#endif
#ifdef LIBXML_OUTPUT_ENABLED
    err |= testCtxtParseContent();
#endif
#ifdef LIBXML_SAX1_ENABLED
    err |= testBalancedChunk();
#endif
#ifdef LIBXML_PUSH_ENABLED
    err |= testHugePush();
    err |= testHugeEncodedChunk();
    err |= testPushCDataEnd();
#endif
#ifdef LIBXML_HTML_ENABLED
    err |= testHtmlIds();
#ifdef LIBXML_PUSH_ENABLED
    err |= testHtmlPushWithEncoding();
#endif
#endif
#ifdef LIBXML_READER_ENABLED
    err |= testReaderEncoding();
    err |= testReaderContent();
    err |= testReader();
#ifdef LIBXML_XINCLUDE_ENABLED
    err |= testReaderXIncludeError();
#endif
#endif
#ifdef LIBXML_WRITER_ENABLED
    err |= testWriterClose();
#endif
    err |= testBuildRelativeUri();
#if defined(_WIN32) || defined(__CYGWIN__)
    err |= testWindowsUri();
#endif
    err |= testCharEncConvImpl();

    return err;
}